

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

bool __thiscall Path::executable(Path *this)

{
  int args;
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  string *__return_storage_ptr__;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Path *pPStack_18;
  int status;
  Path *this_local;
  
  pPStack_18 = this;
  bVar1 = exists(this);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_1c = access(pcVar2,1);
    if (local_1c == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xd) {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"access error {1}: {2}",&local_41);
        piVar3 = __errno_location();
        args = *piVar3;
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        format<int,char*>(__return_storage_ptr__,&local_40,args,pcVar2);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    this_local._7_1_ = local_1c == 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Path::executable () const
{
  if (! exists ())
    return false;

  auto status = access (_data.c_str (), X_OK);
  if (status == -1 && errno != EACCES)
    throw format ("access error {1}: {2}", errno, strerror (errno));

  return status == 0;
}